

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

int qEncodeNtlmString(QNtlmBuffer *buf,int offset,QString *s,bool unicode)

{
  long lVar1;
  qsizetype qVar2;
  byte in_CL;
  QString *in_RDX;
  int in_ESI;
  QNtlmBuffer *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_CL & 1) == 0) {
    QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_24 = qEncodeNtlmBuffer(in_RDI,in_stack_ffffffffffffffac,(QByteArray *)0x20a003);
    QByteArray::~QByteArray((QByteArray *)0x20a011);
  }
  else {
    qVar2 = QString::size(in_RDX);
    in_RDI->len = (quint16)(qVar2 << 1);
    in_RDI->maxLen = in_RDI->len;
    in_RDI->offset = in_ESI + 1U & 0xfffffffe;
    local_24 = in_RDI->offset + (uint)in_RDI->len;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

static int qEncodeNtlmString(QNtlmBuffer& buf, int offset, const QString& s, bool unicode)
{
    if (!unicode)
        return qEncodeNtlmBuffer(buf, offset, s.toLatin1());
    buf.len = 2 * s.size();
    buf.maxLen = buf.len;
    buf.offset = (offset + 1) & ~1;
    return buf.offset + buf.len;
}